

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O0

int ndn_name_append_bytes_component(ndn_name_t *name,uint8_t *value,uint32_t size)

{
  undefined1 local_50 [8];
  name_component_t comp;
  uint32_t size_local;
  uint8_t *value_local;
  ndn_name_t *name_local;
  
  if (name->components_size + 1 < 0xb) {
    comp.value._32_4_ = size;
    unique0x10000052 = value;
    name_component_from_buffer((name_component_t *)local_50,8,value,size);
    ndn_name_append_component(name,(name_component_t *)local_50);
    name_local._4_4_ = 0;
  }
  else {
    name_local._4_4_ = -10;
  }
  return name_local._4_4_;
}

Assistant:

int
ndn_name_append_bytes_component(ndn_name_t* name, const uint8_t* value, uint32_t size)
{
  if (name->components_size + 1 <= NDN_NAME_COMPONENTS_SIZE) {
    name_component_t comp;
    name_component_from_buffer(&comp, TLV_GenericNameComponent, value, size);
    ndn_name_append_component(name, &comp);
    return 0;
  }
  else
    return NDN_OVERSIZE;
}